

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

ON_BrepTrim * __thiscall ON_Brep::NewTrim(ON_Brep *this,int c2i)

{
  int iVar1;
  ON_Curve *real_curve;
  ON_BrepTrim *this_00;
  ON_BoundingBox local_50;
  
  this->m_is_solid = 0;
  iVar1 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  this_00 = ON_ClassArray<ON_BrepTrim>::AppendNew((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
  this_00->m_brep = this;
  this_00->m_trim_index = iVar1;
  this_00->m_ei = -1;
  this_00->m_type = unknown;
  this_00->m_bRev3d = false;
  this_00->m_c2i = c2i;
  this_00->m_iso = not_iso;
  this_00->m_li = -1;
  this_00->m_tolerance[0] = -1.23432101234321e+308;
  this_00->m_tolerance[1] = -1.23432101234321e+308;
  this_00->m__legacy_2d_tol = -1.23432101234321e+308;
  this_00->m__legacy_3d_tol = -1.23432101234321e+308;
  this_00->m__legacy_flags = 0;
  if (((-1 < c2i) && (c2i < (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count)) &&
     (real_curve = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[(uint)c2i],
     real_curve != (ON_Curve *)0x0)) {
    ON_CurveProxy::SetProxyCurve(&this_00->super_ON_CurveProxy,real_curve);
    ON_Geometry::BoundingBox(&local_50,&real_curve->super_ON_Geometry);
    (this_00->m_pbox).m_max.y = local_50.m_max.y;
    (this_00->m_pbox).m_min.z = local_50.m_min.z;
    (this_00->m_pbox).m_max.x = local_50.m_max.x;
    (this_00->m_pbox).m_min.x = local_50.m_min.x;
    (this_00->m_pbox).m_min.y = local_50.m_min.y;
    (this_00->m_pbox).m_min.z = 0.0;
    (this_00->m_pbox).m_max.z = 0.0;
  }
  return this_00;
}

Assistant:

ON_BrepTrim& 
ON_Brep::NewTrim( int c2i )
{
  m_is_solid = 0;
  int ti = m_T.Count();
  ON_BrepTrim& trim = m_T.AppendNew();
  trim.m_brep = this;
  trim.m_trim_index = ti;
  trim.m_ei = -1;
  trim.m_type = ON_BrepTrim::unknown;
  trim.m_bRev3d = false;
  trim.m_c2i = c2i;
  trim.m_iso = ON_Surface::not_iso;
  trim.m_li = -1;
  trim.m_tolerance[0] = ON_UNSET_VALUE;
  trim.m_tolerance[1] = ON_UNSET_VALUE;
  trim.m__legacy_2d_tol = ON_UNSET_VALUE;
  trim.m__legacy_3d_tol = ON_UNSET_VALUE;
  trim.m__legacy_flags = 0;
  const ON_Curve* c2 = (c2i >= 0 && c2i < m_C2.Count()) 
                     ? m_C2[c2i] 
                     : 0;
  if ( c2 ) 
  {
    trim.SetProxyCurve( c2 );
    trim.m_pbox = c2->BoundingBox();
    trim.m_pbox.m_min.z = 0.0;
    trim.m_pbox.m_max.z = 0.0;
  }

  return trim;
}